

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

void booster::aio::socket_pair(stream_socket *s1,stream_socket *s2)

{
  int iVar1;
  int in_RAX [2];
  system_error *this;
  error_code eVar2;
  error_code eVar3;
  int fds [2];
  
  fds = in_RAX;
  iVar1 = socketpair(1,1,0,fds);
  if (-1 < iVar1) {
    basic_io_device::assign((basic_io_device *)s1,fds[0]);
    basic_io_device::assign((basic_io_device *)s2,fds[1]);
    return;
  }
  this = (system_error *)__cxa_allocate_exception(0x40);
  eVar2 = socket_details::geterror();
  eVar3._M_cat = eVar2._M_cat;
  eVar3._4_4_ = 0;
  eVar3._M_value = eVar2._M_value;
  system::system_error::system_error(this,eVar3);
  __cxa_throw(this,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void socket_pair(stream_socket &s1,stream_socket &s2)
{
#ifdef BOOSTER_AIO_NO_PF_UNIX
	acceptor a;
	a.open(pf_inet);
	a.set_option(acceptor::reuse_address,true);
	a.bind(endpoint("127.0.0.1",0));
	a.listen(1);
	s1.open(pf_inet);
	s1.connect(a.local_endpoint());
	a.accept(s2);
	a.close();
#else
	int fds[2];
	if(::socketpair(AF_UNIX,SOCK_STREAM,0,fds) < 0)
		throw system::system_error(geterror());
	s1.assign(fds[0]);
	s2.assign(fds[1]);
#endif
}